

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O1

void __thiscall Heap<SAT::VarOrderLt>::insert(Heap<SAT::VarOrderLt> *this,int n)

{
  double *pdVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  int *piVar6;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int local_18;
  uint local_14;
  
  local_18 = -1;
  local_14 = n;
  vec<int>::growTo(&this->indices,n + 1,&local_18);
  (this->indices).data[local_14] = (this->heap).sz;
  vec<int>::push(&this->heap,(int *)&local_14);
  piVar5 = (this->heap).data;
  uVar8 = (ulong)(uint)(this->indices).data[local_14];
  uVar3 = piVar5[uVar8];
  if (uVar8 != 0) {
    piVar6 = (this->indices).data;
    pdVar7 = ((this->lt).activity)->data;
    dVar2 = pdVar7[uVar3];
    do {
      uVar10 = (int)uVar8 - 1;
      uVar9 = (ulong)(uint)((int)uVar10 >> 1);
      uVar4 = piVar5[uVar9];
      pdVar1 = pdVar7 + uVar4;
      if (dVar2 < *pdVar1 || dVar2 == *pdVar1) break;
      piVar5[uVar8] = uVar4;
      piVar6[uVar4] = (int)uVar8;
      uVar8 = uVar9;
    } while (1 < uVar10);
  }
  piVar5[uVar8] = uVar3;
  (this->indices).data[uVar3] = (int)uVar8;
  return;
}

Assistant:

void insert(int n) {
		indices.growTo(n + 1, -1);
		assert(!inHeap(n));

		indices[n] = heap.size();
		heap.push(n);
		percolateUp(indices[n]);
	}